

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O3

vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
* kratos::get_flatten_slices
            (vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *__return_storage_ptr__,Var *var)

{
  uint uVar1;
  ulong __n;
  undefined1 auVar2 [8];
  uint uVar3;
  uint *puVar4;
  uint *puVar5;
  pointer puVar6;
  uint uVar7;
  ulong uVar8;
  uint *puVar9;
  uint local_78;
  uint *local_70;
  vector<unsigned_int,_std::allocator<unsigned_int>_> sizes;
  undefined1 auStack_48 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> slice;
  
  uVar3 = (*(var->super_IRNode)._vptr_IRNode[7])(var);
  uVar7 = var->var_width_;
  __n = (ulong)uVar3 / (ulong)uVar7;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::reserve(__return_storage_ptr__,__n);
  std::vector<unsigned_int,std::allocator<unsigned_int>>::
  vector<__gnu_cxx::__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_70,
             (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )(var->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
              )(var->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,(allocator_type *)auStack_48);
  puVar5 = sizes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start + -1;
  puVar9 = local_70;
  if (local_70 < puVar5 &&
      local_70 !=
      sizes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start) {
    do {
      puVar4 = puVar9 + 1;
      uVar1 = *puVar9;
      *puVar9 = *puVar5;
      *puVar5 = uVar1;
      puVar5 = puVar5 + -1;
      puVar9 = puVar4;
    } while (puVar4 < puVar5);
  }
  if (uVar7 <= uVar3) {
    uVar7 = 0;
    do {
      auStack_48 = (undefined1  [8])0x0;
      slice.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      slice.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_48,
                 (long)sizes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                       .super__Vector_impl_data._M_start - (long)local_70 >> 2);
      puVar6 = sizes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar8 = (ulong)uVar7;
      for (puVar9 = local_70; puVar9 != puVar6; puVar9 = puVar9 + 1) {
        uVar3 = *puVar9;
        sizes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ = (uint)(uVar8 % (ulong)uVar3);
        if (slice.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start ==
            slice.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_48,
                     (iterator)
                     slice.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start,
                     (uint *)((long)&sizes.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
        }
        else {
          *slice.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start =
               sizes.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_;
          slice.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start =
               slice.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start + 1;
        }
        uVar8 = uVar8 / uVar3;
      }
      puVar6 = slice.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start + -1;
      auVar2 = auStack_48;
      if ((ulong)auStack_48 < puVar6 &&
          auStack_48 !=
          (undefined1  [8])
          slice.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start) {
        do {
          puVar9 = (uint *)((long)auVar2 + 4);
          uVar3 = *(uint *)auVar2;
          *(uint *)auVar2 = *puVar6;
          *puVar6 = uVar3;
          puVar6 = puVar6 + -1;
          auVar2 = (undefined1  [8])puVar9;
        } while (puVar9 < puVar6);
      }
      std::
      vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
      ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>&>
                ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                  *)__return_storage_ptr__,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_48);
      if (auStack_48 != (undefined1  [8])0x0) {
        operator_delete((void *)auStack_48,
                        (long)slice.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)auStack_48);
      }
      uVar7 = uVar7 + 1;
      local_78 = (uint)__n;
    } while (uVar7 < local_78);
  }
  if (local_70 != (uint *)0x0) {
    operator_delete(local_70,(long)sizes.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_finish - (long)local_70);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::vector<uint32_t>> get_flatten_slices(const Var *var) {
    uint32_t num_slices = var->width() / var->var_width();
    std::vector<std::vector<uint32_t>> result;
    result.reserve(num_slices);
    std::vector<uint32_t> sizes = std::vector<uint32_t>(var->size().begin(), var->size().end());
    std::reverse(sizes.begin(), sizes.end());
    for (uint32_t i = 0; i < num_slices; i++) {
        std::vector<uint32_t> slice;
        slice.reserve(sizes.size());
        uint32_t value = i;
        for (auto l: sizes) {
            slice.emplace_back(value % l);
            value /= l;
        }
        std::reverse(slice.begin(), slice.end());
        result.emplace_back(slice);
    }
    return result;
}